

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bson-iter.c
# Opt level: O3

_Bool bson_iter_as_bool(bson_iter_t *iter)

{
  size_t *psVar1;
  long *plVar2;
  uint8_t uVar3;
  byte bVar4;
  size_t sVar5;
  ulong uVar6;
  double dVar7;
  long lVar8;
  int64_t iVar9;
  undefined1 uVar10;
  char cVar11;
  _Bool _Var12;
  uint uVar13;
  int iVar14;
  void *pvVar15;
  undefined8 uVar16;
  long lVar17;
  size_t sVar18;
  char *pcVar19;
  code *pcVar20;
  bson_oid_t *pbVar21;
  char *__s;
  ulong uVar22;
  ulong *in_RCX;
  uint8_t *puVar23;
  uint8_t *puVar24;
  ulong uVar25;
  int32_t iVar26;
  undefined4 *extraout_RDX;
  ulong *extraout_RDX_00;
  undefined4 *extraout_RDX_01;
  undefined8 extraout_RDX_02;
  bson_error_t *error;
  size_t __n;
  bson_json_destroy_cb p_Var27;
  bson_t *in_RSI;
  anon_union_24_17_78d57918_for_value *dst;
  bson_json_reader_cb num_bytes;
  size_t sVar28;
  bson_error_t *__s_00;
  bson_t *pbVar29;
  uint32_t uVar30;
  bool bVar31;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Db;
  bson_error_t bStack_4e0;
  uint32_t uStack_220;
  _Bool _Stack_219;
  bson_t *pbStack_218;
  uint32_t uStack_210;
  uint32_t uStack_20c;
  uint8_t *puStack_208;
  char *apcStack_200 [35];
  
  if (iter != (bson_iter_t *)0x0) {
    puVar23 = iter->raw;
    uVar3 = puVar23[iter->type];
    switch(uVar3) {
    case '\x01':
      return (_Bool)(-(*(double *)(puVar23 + iter->d1) != 0.0) & 1);
    case '\x02':
    case '\x03':
    case '\x04':
    case '\x05':
    case '\a':
    case '\t':
      return true;
    case '\x06':
    case '\n':
      return false;
    case '\b':
      bVar31 = puVar23[iter->d1] == '\0';
      break;
    default:
      if (uVar3 == '\x10') {
        bVar31 = *(int *)(puVar23 + iter->d1) == 0;
      }
      else {
        if (uVar3 != '\x12') {
          return true;
        }
        bVar31 = *(long *)(puVar23 + iter->d1) == 0;
      }
    }
    return !bVar31;
  }
  bson_iter_as_bool_cold_1();
  if ((bson_json_reader_t *)iter != (bson_json_reader_t *)0x0) {
    return SUB81((((bson_json_reader_t *)iter)->producer).data,0);
  }
  bson_iter_double_cold_1();
  if ((bson_json_reader_t *)iter != (bson_json_reader_t *)0x0) {
    puVar23 = (uint8_t *)(((bson_json_reader_t *)iter)->producer).data;
    if (puVar23[*(uint *)&(((bson_json_reader_t *)iter)->producer).dcb] != '\x12') {
      return false;
    }
    return SUB81(*(undefined8 *)(puVar23 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf),0
                );
  }
  bson_iter_int64_cold_1();
  if ((bson_json_reader_t *)iter != (bson_json_reader_t *)0x0) {
    puVar23 = (uint8_t *)(((bson_json_reader_t *)iter)->producer).data;
    uVar10 = 0;
    if (puVar23[*(uint *)&(((bson_json_reader_t *)iter)->producer).dcb] == '\x10') {
      uVar10 = (undefined1)
               *(undefined4 *)(puVar23 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf);
    }
    return (_Bool)uVar10;
  }
  bson_iter_int32_cold_1();
  if ((bson_json_reader_t *)iter != (bson_json_reader_t *)0x0) {
    puVar23 = (uint8_t *)(((bson_json_reader_t *)iter)->producer).data;
    bVar4 = puVar23[*(uint *)&(((bson_json_reader_t *)iter)->producer).dcb];
    _Var12 = SUB81(puVar23,0);
    if (bVar4 < 0x10) {
      if (bVar4 == 1) {
        return _Var12;
      }
      if ((bVar4 == 8) && (puVar23[*(uint *)&(((bson_json_reader_t *)iter)->producer).buf] != '\0'))
      {
        return _Var12;
      }
    }
    else if ((bVar4 != 0x10) && (bVar4 == 0x12)) {
      return _Var12;
    }
    return _Var12;
  }
  bson_iter_as_double_cold_1();
  if ((bson_json_reader_t *)iter != (bson_json_reader_t *)0x0) {
    puVar23 = (uint8_t *)(((bson_json_reader_t *)iter)->producer).data;
    bVar4 = puVar23[*(uint *)&(((bson_json_reader_t *)iter)->producer).dcb];
    uVar10 = 0;
    if (bVar4 < 0x10) {
      if (bVar4 == 1) {
        return SUB81((long)*(double *)
                            (puVar23 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf),0);
      }
      if (bVar4 == 8) {
        return puVar23[*(uint *)&(((bson_json_reader_t *)iter)->producer).buf] != '\0';
      }
    }
    else if (bVar4 == 0x10) {
      uVar10 = (undefined1)
               *(undefined4 *)(puVar23 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf);
    }
    else if (bVar4 == 0x12) {
      return SUB81(*(undefined8 *)(puVar23 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf)
                   ,0);
    }
    return (_Bool)uVar10;
  }
  bson_iter_as_int64_cold_1();
  if ((bson_json_reader_t *)iter != (bson_json_reader_t *)0x0) {
    puVar23 = (uint8_t *)(((bson_json_reader_t *)iter)->producer).data;
    uVar3 = puVar23[*(uint *)&(((bson_json_reader_t *)iter)->producer).dcb];
    if (uVar3 == '\x13') {
      plVar2 = (long *)(puVar23 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf);
      lVar17 = *plVar2;
      lVar8 = plVar2[1];
      in_RSI->flags = (int)lVar17;
      in_RSI->len = (int)((ulong)lVar17 >> 0x20);
      *(long *)in_RSI->padding = lVar8;
    }
    return uVar3 == '\x13';
  }
  bson_iter_decimal128_cold_1();
  if ((bson_json_reader_t *)iter != (bson_json_reader_t *)0x0) {
    puVar23 = (uint8_t *)(((bson_json_reader_t *)iter)->producer).data;
    if (puVar23[*(uint *)&(((bson_json_reader_t *)iter)->producer).dcb] != '\a') {
      return false;
    }
    return (_Bool)((char)puVar23 + (char)*(uint32_t *)&(((bson_json_reader_t *)iter)->producer).buf)
    ;
  }
  bson_iter_oid_cold_1();
  if ((bson_json_reader_t *)iter != (bson_json_reader_t *)0x0) {
    puVar23 = (uint8_t *)(((bson_json_reader_t *)iter)->producer).data;
    if (puVar23[*(uint *)&(((bson_json_reader_t *)iter)->producer).dcb] == '\v') {
      cVar11 = (char)*(uint32_t *)&(((bson_json_reader_t *)iter)->producer).buf + (char)puVar23;
      puVar23 = puVar23 + *(uint32_t *)((long)&(((bson_json_reader_t *)iter)->producer).buf + 4);
    }
    else {
      cVar11 = '\0';
      puVar23 = (uint8_t *)0x0;
    }
    if (in_RSI != (bson_t *)0x0) {
      *(uint8_t **)in_RSI = puVar23;
    }
    return (_Bool)cVar11;
  }
  bson_iter_regex_cold_1();
  if ((bson_json_reader_t *)iter != (bson_json_reader_t *)0x0) {
    puVar23 = (uint8_t *)(((bson_json_reader_t *)iter)->producer).data;
    if (puVar23[*(uint *)&(((bson_json_reader_t *)iter)->producer).dcb] != '\x02') {
      if (in_RSI != (bson_t *)0x0) {
        in_RSI->flags = 0;
      }
      return false;
    }
    if (in_RSI != (bson_t *)0x0) {
      iVar14 = 1;
      if (1 < *(int *)(puVar23 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf)) {
        iVar14 = *(int *)(puVar23 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf);
      }
      in_RSI->flags = iVar14 - 1;
    }
    return (_Bool)((char)puVar23 +
                  (char)*(uint32_t *)((long)&(((bson_json_reader_t *)iter)->producer).buf + 4));
  }
  bson_iter_utf8_cold_1();
  if ((bson_json_reader_t *)iter != (bson_json_reader_t *)0x0) {
    puVar23 = (uint8_t *)(((bson_json_reader_t *)iter)->producer).data;
    if (puVar23[*(uint *)&(((bson_json_reader_t *)iter)->producer).dcb] == '\x02') {
      uVar13 = *(uint32_t *)((long)&(((bson_json_reader_t *)iter)->producer).buf + 4);
      sVar28 = 1;
      if (1 < (int)*(uint *)(puVar23 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf)) {
        sVar28 = (size_t)*(uint *)(puVar23 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf)
        ;
      }
      uVar30 = (int)sVar28 - 1;
      pvVar15 = bson_malloc0(sVar28);
      memcpy(pvVar15,puVar23 + uVar13,(ulong)uVar30);
      *(undefined1 *)((long)pvVar15 + (ulong)uVar30) = 0;
    }
    else {
      uVar30 = 0;
      pvVar15 = (void *)0x0;
    }
    if (in_RSI != (bson_t *)0x0) {
      in_RSI->flags = uVar30;
    }
    return SUB81(pvVar15,0);
  }
  bson_iter_dup_utf8_cold_1();
  if ((bson_json_reader_t *)iter != (bson_json_reader_t *)0x0) {
    puVar23 = (uint8_t *)(((bson_json_reader_t *)iter)->producer).data;
    if (puVar23[*(uint *)&(((bson_json_reader_t *)iter)->producer).dcb] != '\r') {
      if (in_RSI != (bson_t *)0x0) {
        in_RSI->flags = 0;
      }
      return false;
    }
    if (in_RSI != (bson_t *)0x0) {
      iVar14 = 1;
      if (1 < *(int *)(puVar23 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf)) {
        iVar14 = *(int *)(puVar23 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf);
      }
      in_RSI->flags = iVar14 - 1;
    }
    return (_Bool)((char)puVar23 +
                  (char)*(uint32_t *)((long)&(((bson_json_reader_t *)iter)->producer).buf + 4));
  }
  bson_iter_code_cold_1();
  if ((bson_json_reader_t *)iter == (bson_json_reader_t *)0x0) {
    bson_iter_codewscope_cold_2();
  }
  else {
    puVar23 = (uint8_t *)(((bson_json_reader_t *)iter)->producer).data;
    if (puVar23[*(uint *)&(((bson_json_reader_t *)iter)->producer).dcb] != '\x0f') {
      if (in_RSI != (bson_t *)0x0) {
        in_RSI->flags = 0;
      }
      if (extraout_RDX != (undefined4 *)0x0) {
        *extraout_RDX = 0;
      }
      if (in_RCX != (ulong *)0x0) {
        *in_RCX = 0;
      }
      return false;
    }
    if (in_RSI == (bson_t *)0x0) {
LAB_00111197:
      *extraout_RDX =
           *(undefined4 *)
            (puVar23 + *(uint32_t *)((long)&(((bson_json_reader_t *)iter)->producer).buf_size + 4));
      *in_RCX = (ulong)(puVar23 +
                       *(uint32_t *)((long)&(((bson_json_reader_t *)iter)->producer).buf_size + 4));
      return (_Bool)((char)(uint32_t)(((bson_json_reader_t *)iter)->producer).buf_size +
                    (char)(((bson_json_reader_t *)iter)->producer).data);
    }
    if (*(int *)(puVar23 + *(uint32_t *)((long)&(((bson_json_reader_t *)iter)->producer).buf + 4))
        != 0) {
      in_RSI->flags =
           *(int *)(puVar23 + *(uint32_t *)((long)&(((bson_json_reader_t *)iter)->producer).buf + 4)
                   ) - 1;
      goto LAB_00111197;
    }
  }
  bson_iter_codewscope_cold_1();
  if ((bson_json_reader_t *)iter != (bson_json_reader_t *)0x0) {
    if (extraout_RDX_00 != (ulong *)0x0) {
      *extraout_RDX_00 = 0;
    }
    if (in_RCX != (ulong *)0x0) {
      *in_RCX = 0;
    }
    puVar23 = (uint8_t *)(((bson_json_reader_t *)iter)->producer).data;
    if (puVar23[*(uint *)&(((bson_json_reader_t *)iter)->producer).dcb] == '\f') {
      if (in_RSI != (bson_t *)0x0) {
        uVar13 = *(uint *)(puVar23 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf);
        puVar23 = (uint8_t *)(ulong)uVar13;
        in_RSI->flags = uVar13;
        if (uVar13 != 0) {
          puVar23 = (uint8_t *)(ulong)(uVar13 - 1);
          in_RSI->flags = uVar13 - 1;
        }
      }
      if (extraout_RDX_00 != (ulong *)0x0) {
        puVar23 = (uint8_t *)
                  ((long)(((bson_json_reader_t *)iter)->producer).data +
                  (ulong)*(uint32_t *)((long)&(((bson_json_reader_t *)iter)->producer).buf + 4));
        *extraout_RDX_00 = (ulong)puVar23;
      }
      if (in_RCX != (ulong *)0x0) {
        puVar23 = (uint8_t *)
                  ((long)(((bson_json_reader_t *)iter)->producer).data +
                  (ulong)(uint)(((bson_json_reader_t *)iter)->producer).buf_size);
        *in_RCX = (ulong)puVar23;
      }
    }
    return SUB81(puVar23,0);
  }
  bson_iter_dbpointer_cold_1();
  if ((bson_json_reader_t *)iter != (bson_json_reader_t *)0x0) {
    puVar23 = (uint8_t *)(((bson_json_reader_t *)iter)->producer).data;
    if (puVar23[*(uint *)&(((bson_json_reader_t *)iter)->producer).dcb] == '\x0e') {
      cVar11 = (char)*(uint32_t *)((long)&(((bson_json_reader_t *)iter)->producer).buf + 4) +
               (char)puVar23;
      iVar14 = 1;
      if (1 < *(int *)(puVar23 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf)) {
        iVar14 = *(int *)(puVar23 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf);
      }
      uVar30 = iVar14 - 1;
    }
    else {
      cVar11 = '\0';
      uVar30 = 0;
    }
    if (in_RSI != (bson_t *)0x0) {
      in_RSI->flags = uVar30;
    }
    return (_Bool)cVar11;
  }
  bson_iter_symbol_cold_1();
  if ((bson_json_reader_t *)iter != (bson_json_reader_t *)0x0) {
    puVar23 = (uint8_t *)(((bson_json_reader_t *)iter)->producer).data;
    if (puVar23[*(uint *)&(((bson_json_reader_t *)iter)->producer).dcb] != '\t') {
      return false;
    }
    return SUB81(*(undefined8 *)(puVar23 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf),0
                );
  }
  bson_iter_date_time_cold_1();
  if ((bson_json_reader_t *)iter != (bson_json_reader_t *)0x0) {
    puVar23 = (uint8_t *)(((bson_json_reader_t *)iter)->producer).data;
    if (puVar23[*(uint *)&(((bson_json_reader_t *)iter)->producer).dcb] != '\t') {
      return false;
    }
    return SUB81(*(ulong *)(puVar23 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf) / 1000
                 ,0);
  }
  bson_iter_time_t_cold_1();
  if ((bson_json_reader_t *)iter != (bson_json_reader_t *)0x0) {
    puVar23 = (uint8_t *)(((bson_json_reader_t *)iter)->producer).data;
    uVar30 = 0;
    uVar16 = 0;
    if (puVar23[*(uint *)&(((bson_json_reader_t *)iter)->producer).dcb] == '\x11') {
      uVar16 = *(undefined8 *)(puVar23 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf);
      uVar30 = (uint32_t)((ulong)uVar16 >> 0x20);
    }
    if (in_RSI != (bson_t *)0x0) {
      in_RSI->flags = uVar30;
    }
    if (extraout_RDX_01 != (undefined4 *)0x0) {
      *extraout_RDX_01 = (int)uVar16;
    }
    return SUB81(uVar16,0);
  }
  bson_iter_timestamp_cold_1();
  if ((bson_json_reader_t *)iter != (bson_json_reader_t *)0x0) {
    puVar23 = (uint8_t *)(((bson_json_reader_t *)iter)->producer).data;
    if (puVar23[*(uint *)&(((bson_json_reader_t *)iter)->producer).dcb] != '\t') {
      in_RSI->flags = 0;
      in_RSI->len = 0;
      in_RSI->padding[0] = '\0';
      in_RSI->padding[1] = '\0';
      in_RSI->padding[2] = '\0';
      in_RSI->padding[3] = '\0';
      in_RSI->padding[4] = '\0';
      in_RSI->padding[5] = '\0';
      in_RSI->padding[6] = '\0';
      in_RSI->padding[7] = '\0';
      return SUB81(puVar23,0);
    }
    lVar17 = *(long *)(puVar23 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf);
    *(long *)in_RSI = lVar17 / 1000;
    lVar17 = (lVar17 % 1000) * 1000;
    *(long *)in_RSI->padding = lVar17;
    return SUB81(lVar17,0);
  }
  bson_iter_timeval_cold_1();
  if ((bson_json_reader_t *)iter == (bson_json_reader_t *)0x0) {
    bson_iter_visit_all_cold_2();
  }
  else if (in_RSI != (bson_t *)0x0) {
    _Var12 = _bson_iter_next_internal(iter,(char **)&puStack_208,&uStack_210,&_Stack_219);
    if (_Var12) {
      do {
        puVar23 = puStack_208;
        if (*puStack_208 != '\0') {
          sVar18 = strlen((char *)puStack_208);
          _Var12 = bson_utf8_validate((char *)puVar23,sVar18,false);
          if (!_Var12) {
            *(uint32_t *)((long)&(((bson_json_reader_t *)iter)->producer).bytes_read + 4) =
                 *(uint32_t *)((long)&(((bson_json_reader_t *)iter)->producer).cb + 4);
            break;
          }
        }
        if ((*(code **)in_RSI != (code *)0x0) &&
           (cVar11 = (**(code **)in_RSI)(iter,puVar23,extraout_RDX_02), cVar11 != '\0')) {
          return true;
        }
        switch(uStack_210) {
        case 1:
          pcVar20 = *(code **)(in_RSI->padding + 0x10);
          if (pcVar20 == (code *)0x0) break;
          dVar7 = bson_iter_double(iter);
          cVar11 = (*pcVar20)(SUB84(dVar7,0),iter,puVar23,extraout_RDX_02);
          goto LAB_001118b2;
        case 2:
          pcVar19 = bson_iter_utf8(iter,(uint32_t *)apcStack_200);
          _Var12 = bson_utf8_validate(pcVar19,(ulong)apcStack_200[0] & 0xffffffff,true);
          if (!_Var12) {
LAB_00111968:
            *(uint32_t *)((long)&(((bson_json_reader_t *)iter)->producer).bytes_read + 4) =
                 *(uint32_t *)((long)&(((bson_json_reader_t *)iter)->producer).cb + 4);
            return true;
          }
          pcVar20 = *(code **)(in_RSI->padding + 0x18);
          goto LAB_001117d4;
        case 3:
          pbStack_218 = (bson_t *)0x0;
          uStack_220 = 0;
          bson_iter_document(iter,&uStack_220,(uint8_t **)&pbStack_218);
          _Var12 = bson_init_static((bson_t *)apcStack_200,(uint8_t *)pbStack_218,(ulong)uStack_220)
          ;
          if (_Var12) {
            pcVar20 = *(code **)(in_RSI->padding + 0x20);
            goto LAB_0011181e;
          }
          break;
        case 4:
          pbStack_218 = (bson_t *)0x0;
          uStack_220 = 0;
          bson_iter_array(iter,&uStack_220,(uint8_t **)&pbStack_218);
          _Var12 = bson_init_static((bson_t *)apcStack_200,(uint8_t *)pbStack_218,(ulong)uStack_220)
          ;
          if (_Var12) {
            pcVar20 = *(code **)(in_RSI->padding + 0x28);
            goto LAB_0011181e;
          }
          break;
        case 5:
          apcStack_200[0] = (char *)0x0;
          pbStack_218 = (bson_t *)((ulong)pbStack_218 & 0xffffffff00000000);
          uStack_220 = 0;
          bson_iter_binary(iter,(bson_subtype_t *)&pbStack_218,&uStack_220,(uint8_t **)apcStack_200)
          ;
          if (*(code **)(in_RSI->padding + 0x30) != (code *)0x0) {
            cVar11 = (**(code **)(in_RSI->padding + 0x30))
                               (iter,puVar23,(ulong)pbStack_218 & 0xffffffff,uStack_220,
                                apcStack_200[0],extraout_RDX_02);
            goto LAB_001118b2;
          }
          break;
        case 6:
          pcVar20 = *(code **)(in_RSI->padding + 0x38);
          goto LAB_0011178a;
        case 7:
          pcVar20 = *(code **)(in_RSI->padding + 0x40);
          if (pcVar20 != (code *)0x0) {
            pbVar21 = bson_iter_oid(iter);
LAB_001118a3:
            cVar11 = (*pcVar20)(iter,puVar23,pbVar21,extraout_RDX_02);
            goto LAB_001118b2;
          }
          break;
        case 8:
          pcVar20 = *(code **)(in_RSI->padding + 0x48);
          if (pcVar20 != (code *)0x0) {
            _Var12 = bson_iter_bool(iter);
            uVar13 = (uint)_Var12;
LAB_00111710:
            cVar11 = (*pcVar20)(iter,puVar23,uVar13,extraout_RDX_02);
            goto LAB_001118b2;
          }
          break;
        case 9:
          pcVar20 = *(code **)(in_RSI->padding + 0x50);
          if (pcVar20 != (code *)0x0) {
            pbVar21 = (bson_oid_t *)bson_iter_date_time(iter);
            goto LAB_001118a3;
          }
          break;
        case 10:
          pcVar20 = *(code **)(in_RSI->padding + 0x58);
LAB_0011178a:
          if (pcVar20 == (code *)0x0) break;
LAB_00111799:
          cVar11 = (*pcVar20)(iter,puVar23,extraout_RDX_02);
          goto LAB_001118b2;
        case 0xb:
          apcStack_200[0] = (char *)0x0;
          __s = bson_iter_regex(iter,apcStack_200);
          sVar18 = strlen(__s);
          _Var12 = bson_utf8_validate(__s,sVar18,true);
          if (!_Var12) goto LAB_00111968;
          pcVar20 = *(code **)(in_RSI->padding + 0x60);
          pcVar19 = apcStack_200[0];
          if (pcVar20 == (code *)0x0) break;
          goto LAB_0011188b;
        case 0xc:
          uStack_220 = 0;
          apcStack_200[0] = (char *)0x0;
          pbStack_218 = (bson_t *)0x0;
          bson_iter_dbpointer(iter,&uStack_220,apcStack_200,(bson_oid_t **)&pbStack_218);
          _Var12 = bson_utf8_validate(apcStack_200[0],(ulong)uStack_220,true);
          if (!_Var12) goto LAB_00111968;
          pcVar20 = *(code **)(in_RSI->padding + 0x68);
          pcVar19 = apcStack_200[0];
          pbVar29 = pbStack_218;
          if (pcVar20 != (code *)0x0) {
LAB_001115a8:
            cVar11 = (*pcVar20)(iter,puVar23,uStack_220,pcVar19,pbVar29,extraout_RDX_02);
            goto LAB_001118b2;
          }
          break;
        case 0xd:
          pcVar19 = bson_iter_code(iter,(uint32_t *)apcStack_200);
          _Var12 = bson_utf8_validate(pcVar19,(ulong)apcStack_200[0] & 0xffffffff,true);
          if (!_Var12) goto LAB_00111968;
          pcVar20 = *(code **)(in_RSI->padding + 0x70);
          goto LAB_001117d4;
        case 0xe:
          pcVar19 = bson_iter_symbol(iter,(uint32_t *)apcStack_200);
          _Var12 = bson_utf8_validate(pcVar19,(ulong)apcStack_200[0] & 0xffffffff,true);
          if (!_Var12) goto LAB_00111968;
          pcVar20 = *(code **)(in_RSI + 1);
LAB_001117d4:
          if (pcVar20 != (code *)0x0) {
            __s = (char *)((ulong)apcStack_200[0] & 0xffffffff);
LAB_0011188b:
            cVar11 = (*pcVar20)(iter,puVar23,__s,pcVar19,extraout_RDX_02);
LAB_001118b2:
            if (cVar11 != '\0') {
              return true;
            }
          }
          break;
        case 0xf:
          uStack_220 = 0;
          pbStack_218 = (bson_t *)0x0;
          uStack_20c = 0;
          pcVar19 = bson_iter_codewscope(iter,&uStack_220,&uStack_20c,(uint8_t **)&pbStack_218);
          _Var12 = bson_utf8_validate(pcVar19,(ulong)uStack_220,true);
          if (!_Var12) goto LAB_00111968;
          _Var12 = bson_init_static((bson_t *)apcStack_200,(uint8_t *)pbStack_218,(ulong)uStack_20c)
          ;
          if ((_Var12) && (pcVar20 = *(code **)in_RSI[1].padding, pcVar20 != (code *)0x0)) {
            pbVar29 = (bson_t *)apcStack_200;
            goto LAB_001115a8;
          }
          break;
        case 0x10:
          pcVar20 = *(code **)(in_RSI[1].padding + 8);
          if (pcVar20 != (code *)0x0) {
            uVar13 = bson_iter_int32(iter);
            goto LAB_00111710;
          }
          break;
        case 0x11:
          bson_iter_timestamp(iter,(uint32_t *)apcStack_200,(uint32_t *)&pbStack_218);
          if (*(code **)(in_RSI[1].padding + 0x10) != (code *)0x0) {
            cVar11 = (**(code **)(in_RSI[1].padding + 0x10))
                               (iter,puVar23,(ulong)apcStack_200[0] & 0xffffffff,
                                (ulong)pbStack_218 & 0xffffffff,extraout_RDX_02);
            goto LAB_001118b2;
          }
          break;
        case 0x12:
          pcVar20 = *(code **)(in_RSI[1].padding + 0x18);
          if (pcVar20 != (code *)0x0) {
            pbVar21 = (bson_oid_t *)bson_iter_int64(iter);
            goto LAB_001118a3;
          }
          break;
        case 0x13:
          bson_iter_decimal128(iter,(bson_decimal128_t *)apcStack_200);
          pcVar20 = *(code **)(in_RSI[1].padding + 0x38);
LAB_0011181e:
          if (pcVar20 != (code *)0x0) {
            cVar11 = (*pcVar20)(iter,puVar23,(bson_t *)apcStack_200,extraout_RDX_02);
            goto LAB_001118b2;
          }
          break;
        default:
          if (uStack_210 == 0x7f) {
            pcVar20 = *(code **)(in_RSI[1].padding + 0x20);
          }
          else {
            if (uStack_210 != 0xff) break;
            pcVar20 = *(code **)(in_RSI[1].padding + 0x28);
          }
          if (pcVar20 == (code *)0x0) break;
          puVar23 = (uint8_t *)
                    ((long)(((bson_json_reader_t *)iter)->producer).data +
                    (ulong)*(uint32_t *)((long)&(((bson_json_reader_t *)iter)->producer).dcb + 4));
          goto LAB_00111799;
        }
        if ((*(code **)in_RSI->padding != (code *)0x0) &&
           (cVar11 = (**(code **)in_RSI->padding)
                               (iter,(uint8_t *)
                                     ((long)(((bson_json_reader_t *)iter)->producer).data +
                                     (ulong)*(uint32_t *)
                                             ((long)&(((bson_json_reader_t *)iter)->producer).dcb +
                                             4)),extraout_RDX_02), cVar11 != '\0')) {
          return true;
        }
        _Var12 = _bson_iter_next_internal(iter,(char **)&puStack_208,&uStack_210,&_Stack_219);
      } while (_Var12);
    }
    if (*(uint32_t *)((long)&(((bson_json_reader_t *)iter)->producer).bytes_read + 4) != 0) {
      if ((_Stack_219 == true) && (*(long *)(in_RSI[1].padding + 0x30) != 0)) {
        sVar18 = strlen((char *)puStack_208);
        _Var12 = bson_utf8_validate((char *)puStack_208,sVar18,false);
        if (_Var12) {
          (**(code **)(in_RSI[1].padding + 0x30))(iter,puStack_208,uStack_210,extraout_RDX_02);
          return false;
        }
      }
      if (*(code **)(in_RSI->padding + 8) != (code *)0x0) {
        (**(code **)(in_RSI->padding + 8))(iter,extraout_RDX_02);
      }
    }
    return false;
  }
  bson_iter_visit_all_cold_1();
  if ((bson_json_reader_t *)iter != (bson_json_reader_t *)0x0) {
    puVar23 = (uint8_t *)(((bson_json_reader_t *)iter)->producer).data;
    if (puVar23[*(uint *)&(((bson_json_reader_t *)iter)->producer).dcb] == '\b') {
      puVar23[*(uint *)&(((bson_json_reader_t *)iter)->producer).buf] = (uint8_t)in_RSI;
    }
    return SUB81(puVar23,0);
  }
  bson_iter_overwrite_bool_cold_1();
  if ((bson_json_reader_t *)iter != (bson_json_reader_t *)0x0) {
    puVar23 = (uint8_t *)(((bson_json_reader_t *)iter)->producer).data;
    if (puVar23[*(uint *)&(((bson_json_reader_t *)iter)->producer).dcb] == '\x10') {
      *(int *)(puVar23 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf) = (int)in_RSI;
    }
    return SUB81(puVar23,0);
  }
  bson_iter_overwrite_int32_cold_1();
  if ((bson_json_reader_t *)iter != (bson_json_reader_t *)0x0) {
    puVar23 = (uint8_t *)(((bson_json_reader_t *)iter)->producer).data;
    if (puVar23[*(uint *)&(((bson_json_reader_t *)iter)->producer).dcb] == '\x12') {
      *(bson_t **)(puVar23 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf) = in_RSI;
    }
    return SUB81(puVar23,0);
  }
  bson_iter_overwrite_int64_cold_1();
  if ((bson_json_reader_t *)iter != (bson_json_reader_t *)0x0) {
    puVar23 = (uint8_t *)(((bson_json_reader_t *)iter)->producer).data;
    if (puVar23[*(uint *)&(((bson_json_reader_t *)iter)->producer).dcb] == '\x01') {
      *(ulong *)(puVar23 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf) =
           CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da);
    }
    return SUB81(puVar23,0);
  }
  bson_iter_overwrite_double_cold_1();
  if ((bson_json_reader_t *)iter != (bson_json_reader_t *)0x0) {
    puVar23 = (uint8_t *)(((bson_json_reader_t *)iter)->producer).data;
    if (puVar23[*(uint *)&(((bson_json_reader_t *)iter)->producer).dcb] == '\x13') {
      uVar13 = *(uint *)&(((bson_json_reader_t *)iter)->producer).buf;
      lVar17 = *(long *)in_RSI->padding;
      *(long *)(puVar23 + uVar13) = *(long *)in_RSI;
      *(long *)((long)(puVar23 + uVar13) + 8) = lVar17;
    }
    return SUB81(puVar23,0);
  }
  bson_iter_overwrite_decimal128_cold_1();
  if ((bson_json_reader_t *)iter == (bson_json_reader_t *)0x0) {
    bson_iter_value_cold_1();
    if ((bson_json_reader_t *)iter == (bson_json_reader_t *)0x0) {
      bson_json_reader_read_cold_2();
    }
    else if (in_RSI != (bson_t *)0x0) {
      (((bson_json_reader_t *)iter)->bson).bson = in_RSI;
      (((bson_json_reader_t *)iter)->bson).n = -1;
      (((bson_json_reader_t *)iter)->bson).read_state = BSON_JSON_REGULAR;
      __s_00 = &bStack_4e0;
      if (error != (bson_error_t *)0x0) {
        __s_00 = error;
      }
      ((bson_json_reader_t *)iter)->error = __s_00;
      memset(__s_00,0,0x200);
      sVar28 = (((bson_json_reader_t *)iter)->producer).bytes_read;
      bVar31 = false;
      while( true ) {
        sVar5 = ((bson_json_reader_t *)iter)->json->pos;
        if (sVar28 == 0) {
          sVar28 = (*(((bson_json_reader_t *)iter)->producer).cb)
                             ((((bson_json_reader_t *)iter)->producer).data,
                              (((bson_json_reader_t *)iter)->producer).buf,
                              (((bson_json_reader_t *)iter)->producer).buf_size);
        }
        if ((long)sVar28 < 0) {
          if (error != (bson_error_t *)0x0) {
            bson_set_error(error,1,3,"reader cb failed");
            return true;
          }
          return true;
        }
        if (sVar28 == 0) break;
        (((bson_json_reader_t *)iter)->producer).bytes_read = sVar28;
        jsonsl_feed(((bson_json_reader_t *)iter)->json,
                    (jsonsl_char_t *)(((bson_json_reader_t *)iter)->producer).buf,sVar28);
        if (((bson_json_reader_t *)iter)->should_reset == true) {
          jsonsl_reset(((bson_json_reader_t *)iter)->json);
          ((bson_json_reader_t *)iter)->should_reset = false;
          puVar23 = (((bson_json_reader_t *)iter)->producer).buf;
          memmove(puVar23,puVar23 + ((bson_json_reader_t *)iter)->advance,
                  sVar28 - ((bson_json_reader_t *)iter)->advance);
          psVar1 = &(((bson_json_reader_t *)iter)->producer).bytes_read;
          *psVar1 = *psVar1 - ((bson_json_reader_t *)iter)->advance;
          goto LAB_00111ddb;
        }
        if (((bson_json_reader_t *)iter)->error->domain != 0) {
          return true;
        }
        uVar25 = ((bson_json_reader_t *)iter)->json_text_pos;
        if ((uVar25 != 0xffffffffffffffff) &&
           (uVar6 = ((bson_json_reader_t *)iter)->json->pos, uVar22 = uVar6 - uVar25,
           uVar25 <= uVar6 && uVar22 != 0)) {
          if (uVar22 < sVar28) {
            sVar28 = uVar22;
          }
          lVar17 = uVar25 - sVar5;
          if (lVar17 < 1) {
            lVar17 = 0;
          }
          _bson_json_buf_append
                    (&((bson_json_reader_t *)iter)->tok_accumulator,
                     (((bson_json_reader_t *)iter)->producer).buf + lVar17,sVar28);
        }
        (((bson_json_reader_t *)iter)->producer).bytes_read = 0;
        bVar31 = true;
        sVar28 = 0;
      }
      if (!bVar31) {
        return false;
      }
LAB_00111ddb:
      if ((((bson_json_reader_t *)iter)->bson).read_state != BSON_JSON_DONE) {
        _bson_json_read_corrupt((bson_json_reader_t *)iter,"%s","Incomplete JSON");
        return true;
      }
      return true;
    }
    bson_json_reader_read_cold_1();
    p_Var27 = (((bson_json_reader_t *)iter)->producer).dcb;
    if (p_Var27 == (bson_json_destroy_cb)0x0) {
      _bson_json_buf_ensure((bson_json_buf_t *)iter,__n + 1);
      pvVar15 = (((bson_json_reader_t *)iter)->producer).data;
    }
    else {
      pvVar15 = (((bson_json_reader_t *)iter)->producer).data;
      if ((((bson_json_reader_t *)iter)->producer).cb < p_Var27 + __n + 1) {
        uVar25 = (ulong)(p_Var27 + __n) >> 1 | (ulong)(p_Var27 + __n);
        uVar25 = uVar25 >> 2 | uVar25;
        uVar25 = uVar25 >> 4 | uVar25;
        uVar25 = uVar25 >> 8 | uVar25;
        uVar25 = uVar25 >> 0x10 | uVar25;
        num_bytes = (bson_json_reader_cb)((uVar25 >> 0x20 | uVar25) + 1);
        (((bson_json_reader_t *)iter)->producer).cb = num_bytes;
        pvVar15 = bson_realloc(pvVar15,(size_t)num_bytes);
        (((bson_json_reader_t *)iter)->producer).data = pvVar15;
      }
    }
    memcpy((bson_json_destroy_cb)
           ((long)pvVar15 + (long)(((bson_json_reader_t *)iter)->producer).dcb),in_RSI,__n);
    p_Var27 = (((bson_json_reader_t *)iter)->producer).dcb + __n;
    (((bson_json_reader_t *)iter)->producer).dcb = p_Var27;
    pvVar15 = (((bson_json_reader_t *)iter)->producer).data;
    p_Var27[(long)pvVar15] = (_func_void_void_ptr)0x0;
    return SUB81(pvVar15,0);
  }
  puVar23 = (uint8_t *)(((bson_json_reader_t *)iter)->producer).data;
  uVar13 = *(uint *)&(((bson_json_reader_t *)iter)->producer).dcb;
  bVar4 = puVar23[uVar13];
  ((bson_value_t *)&(((bson_json_reader_t *)iter)->producer).bytes_parsed)->value_type = (uint)bVar4
  ;
  switch(bVar4) {
  case 1:
    dVar7 = bson_iter_double(iter);
    ((anon_union_24_17_78d57918_for_value *)&(((bson_json_reader_t *)iter)->producer).all_whitespace
    )->v_double = dVar7;
    break;
  case 2:
    pcVar19 = bson_iter_utf8(iter,(uint32_t *)&((bson_json_reader_t *)iter)->field_0x40);
    goto LAB_00111c23;
  case 3:
    bson_iter_document(iter,(uint32_t *)&((bson_json_reader_t *)iter)->field_0x40,
                       (uint8_t **)
                       &((anon_union_24_17_78d57918_for_value *)
                        &(((bson_json_reader_t *)iter)->producer).all_whitespace)->v_int64);
    break;
  case 4:
    bson_iter_array(iter,(uint32_t *)&((bson_json_reader_t *)iter)->field_0x40,
                    (uint8_t **)
                    &((anon_union_24_17_78d57918_for_value *)
                     &(((bson_json_reader_t *)iter)->producer).all_whitespace)->v_int64);
    break;
  case 5:
    bson_iter_binary(iter,(bson_subtype_t *)&((bson_json_reader_t *)iter)->field_0x44,
                     (uint32_t *)&((bson_json_reader_t *)iter)->field_0x40,
                     (uint8_t **)
                     &((anon_union_24_17_78d57918_for_value *)
                      &(((bson_json_reader_t *)iter)->producer).all_whitespace)->v_int64);
    break;
  case 6:
  case 10:
    break;
  case 7:
    pbVar21 = bson_iter_oid(iter);
    dst = (anon_union_24_17_78d57918_for_value *)
          &(((bson_json_reader_t *)iter)->producer).all_whitespace;
    goto LAB_00111b7e;
  case 8:
    _Var12 = bson_iter_bool(iter);
    ((anon_union_24_17_78d57918_for_value *)&(((bson_json_reader_t *)iter)->producer).all_whitespace
    )->v_bool = _Var12;
    break;
  case 9:
    pcVar19 = (char *)bson_iter_date_time(iter);
    goto LAB_00111c23;
  case 0xb:
    pcVar19 = bson_iter_regex(iter,(char **)&((bson_json_reader_t *)iter)->field_0x40);
    goto LAB_00111c23;
  case 0xc:
    ((anon_union_24_17_78d57918_for_value *)&(((bson_json_reader_t *)iter)->producer).all_whitespace
    )->v_int64 = 0;
    pbVar21 = (bson_oid_t *)0x0;
    if (puVar23[uVar13] == '\f') {
      uVar13 = *(uint32_t *)((long)&(((bson_json_reader_t *)iter)->producer).buf + 4);
      iVar14 = *(int *)(puVar23 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf) + -1;
      if (*(int *)(puVar23 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf) == 0) {
        iVar14 = 0;
      }
      *(int *)&((bson_json_reader_t *)iter)->field_0x40 = iVar14;
      (((anon_union_24_17_78d57918_for_value *)
       &(((bson_json_reader_t *)iter)->producer).all_whitespace)->v_utf8).str =
           (char *)(puVar23 + uVar13);
      pbVar21 = (bson_oid_t *)(puVar23 + (uint)(((bson_json_reader_t *)iter)->producer).buf_size);
    }
    dst = (anon_union_24_17_78d57918_for_value *)&((bson_json_reader_t *)iter)->field_0x44;
LAB_00111b7e:
    bson_oid_copy(pbVar21,&dst->v_oid);
    break;
  case 0xd:
    if (puVar23[uVar13] == '\r') {
      iVar14 = 1;
      if (1 < *(int *)(puVar23 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf)) {
        iVar14 = *(int *)(puVar23 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf);
      }
      iVar14 = iVar14 + -1;
      puVar24 = puVar23 + *(uint32_t *)((long)&(((bson_json_reader_t *)iter)->producer).buf + 4);
    }
    else {
      iVar14 = 0;
      puVar24 = (uint8_t *)0x0;
    }
    *(int *)&((bson_json_reader_t *)iter)->field_0x40 = iVar14;
    goto LAB_00111c30;
  case 0xe:
    if (puVar23[uVar13] == '\x0e') {
      puVar24 = puVar23 + *(uint32_t *)((long)&(((bson_json_reader_t *)iter)->producer).buf + 4);
      iVar14 = 1;
      if (1 < *(int *)(puVar23 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf)) {
        iVar14 = *(int *)(puVar23 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf);
      }
      iVar14 = iVar14 + -1;
    }
    else {
      puVar24 = (uint8_t *)0x0;
      iVar14 = 0;
    }
    *(int *)&((bson_json_reader_t *)iter)->field_0x40 = iVar14;
LAB_00111c30:
    (((anon_union_24_17_78d57918_for_value *)
     &(((bson_json_reader_t *)iter)->producer).all_whitespace)->v_utf8).str = (char *)puVar24;
    break;
  case 0xf:
    pcVar19 = bson_iter_codewscope
                        (iter,(uint32_t *)&((bson_json_reader_t *)iter)->field_0x48,
                         (uint32_t *)&((bson_json_reader_t *)iter)->field_0x4c,
                         (uint8_t **)&((bson_json_reader_t *)iter)->field_0x40);
    goto LAB_00111c23;
  case 0x10:
    iVar26 = 0;
    if (puVar23[uVar13] == '\x10') {
      iVar26 = *(int32_t *)(puVar23 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf);
    }
    ((anon_union_24_17_78d57918_for_value *)&(((bson_json_reader_t *)iter)->producer).all_whitespace
    )->v_int32 = iVar26;
    break;
  case 0x11:
    iVar26 = 0;
    uVar16 = 0;
    if (puVar23[uVar13] == '\x11') {
      uVar16 = *(undefined8 *)(puVar23 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf);
      iVar26 = (int32_t)((ulong)uVar16 >> 0x20);
    }
    ((anon_union_24_17_78d57918_for_value *)&(((bson_json_reader_t *)iter)->producer).all_whitespace
    )->v_int32 = iVar26;
    *(int *)&(((bson_json_reader_t *)iter)->producer).field_0x3c = (int)uVar16;
    break;
  case 0x12:
    if (puVar23[uVar13] == '\x12') {
      pcVar19 = *(char **)(puVar23 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf);
    }
    else {
      pcVar19 = (char *)0x0;
    }
LAB_00111c23:
    ((anon_union_24_17_78d57918_for_value *)&(((bson_json_reader_t *)iter)->producer).all_whitespace
    )->v_int64 = (int64_t)pcVar19;
    break;
  case 0x13:
    if (puVar23[uVar13] == '\x13') {
      iVar9 = *(int64_t *)
               ((long)(puVar23 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf) + 8);
      ((anon_union_24_17_78d57918_for_value *)
      &(((bson_json_reader_t *)iter)->producer).all_whitespace)->v_int64 =
           *(int64_t *)(puVar23 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf);
      *(int64_t *)&((bson_json_reader_t *)iter)->field_0x40 = iVar9;
    }
    break;
  default:
    if ((bVar4 != BSON_TYPE_MAXKEY) && (bVar4 != 0xff)) {
      return false;
    }
  }
  return (_Bool)((char)iter + '0');
}

Assistant:

bool
bson_iter_as_bool (const bson_iter_t *iter) /* IN */
{
   BSON_ASSERT (iter);

   switch ((int) ITER_TYPE (iter)) {
   case BSON_TYPE_BOOL:
      return bson_iter_bool (iter);
   case BSON_TYPE_DOUBLE:
      return !(bson_iter_double (iter) == 0.0);
   case BSON_TYPE_INT64:
      return !(bson_iter_int64 (iter) == 0);
   case BSON_TYPE_INT32:
      return !(bson_iter_int32 (iter) == 0);
   case BSON_TYPE_UTF8:
      return true;
   case BSON_TYPE_NULL:
   case BSON_TYPE_UNDEFINED:
      return false;
   default:
      return true;
   }
}